

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_container.cc
# Opt level: O3

int main(void)

{
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> i1;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> i1_00;
  value_type *__val;
  long lVar1;
  value_type *__val_1;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> i2;
  ret_t rVar2;
  yarn2 R;
  yarn2 yStack_38;
  
  trng::yarn2::yarn2(&yStack_38,trng::yarn2::LEcuyer1);
  i1._M_current = (long *)operator_new(0x50);
  *i1._M_current = 0;
  i1._M_current[1] = 0;
  i1._M_current[2] = 0;
  i1._M_current[3] = 0;
  i1._M_current[4] = 0;
  i1._M_current[5] = 0;
  i1._M_current[6] = 0;
  i1._M_current[7] = 0;
  i1._M_current[8] = 0;
  i1._M_current[9] = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"random number generation by call operator\n",0x2a);
  lVar1 = 0;
  do {
    rVar2 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn2>::addin(&yStack_38);
    *(long *)((long)i1._M_current + lVar1) = (long)(int)(rVar2 * 4.656612875245797e-10 * 100.0);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x50);
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            (i1,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                (i1._M_current + 10));
  i1_00._M_current = (long *)operator_new(0x60);
  i1_00._M_current[10] = 0;
  i1_00._M_current[0xb] = 0;
  i1_00._M_current[8] = 0;
  i1_00._M_current[9] = 0;
  i1_00._M_current[6] = 0;
  i1_00._M_current[7] = 0;
  i1_00._M_current[4] = 0;
  i1_00._M_current[5] = 0;
  i1_00._M_current[2] = 0;
  i1_00._M_current[3] = 0;
  *i1_00._M_current = 0;
  i1_00._M_current[1] = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"random number generation by std::generate\n",0x2a);
  i2._M_current = i1_00._M_current + 0xc;
  lVar1 = 0;
  do {
    rVar2 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn2>::addin(&yStack_38);
    *(long *)((long)i1_00._M_current + lVar1) = (long)(int)(rVar2 * 4.656612875245797e-10 * 100.0);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x60);
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>(i1_00,i2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"random number generation by std::generate\n",0x2a);
  lVar1 = 0;
  do {
    rVar2 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn2>::addin(&yStack_38);
    *(long *)((long)i1_00._M_current + lVar1) = (long)(int)(rVar2 * 4.656612875245797e-10 * 100.0);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x60);
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>(i1_00,i2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"same sequence as above, but in a random shuffled order\n",0x37);
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,trng::yarn2&>
            (i1_00,i2,&yStack_38);
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>(i1_00,i2);
  operator_delete(i1_00._M_current);
  operator_delete(i1._M_current);
  return 0;
}

Assistant:

int main() {
  trng::yarn2 R;
  trng::uniform_int_dist U(0, 100);
  std::vector<long> v(10);

  std::cout << "random number generation by call operator\n";
  for (auto &val : v)
    val = U(R);
  print_range(v.begin(), v.end());
  std::vector<long> w(12);
  std::cout << "random number generation by std::generate\n";
  std::generate(w.begin(), w.end(), std::bind(U, std::ref(R)));
  print_range(w.begin(), w.end());
  std::cout << "random number generation by std::generate\n";
  std::generate(w.begin(), w.end(), std::bind(U, std::ref(R)));
  print_range(w.begin(), w.end());
  std::cout << "same sequence as above, but in a random shuffled order\n";
  std::shuffle(w.begin(), w.end(), R);
  print_range(w.begin(), w.end());
  return EXIT_SUCCESS;
}